

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_0::ReportReflectionUsageError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,char *description)

{
  LogMessage *pLVar1;
  string *psVar2;
  LogFinisher local_6d [13];
  LogMessage local_60;
  char *local_28;
  char *description_local;
  char *method_local;
  FieldDescriptor *field_local;
  Descriptor *descriptor_local;
  
  local_28 = description;
  description_local = method;
  method_local = (char *)field;
  field_local = (FieldDescriptor *)descriptor;
  LogMessage::LogMessage
            (&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0x65);
  pLVar1 = LogMessage::operator<<
                     (&local_60,
                      "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::"
                     );
  pLVar1 = LogMessage::operator<<(pLVar1,description_local);
  pLVar1 = LogMessage::operator<<(pLVar1,"\n  Message type: ");
  psVar2 = Descriptor::full_name_abi_cxx11_((Descriptor *)field_local);
  pLVar1 = LogMessage::operator<<(pLVar1,psVar2);
  pLVar1 = LogMessage::operator<<(pLVar1,"\n  Field       : ");
  psVar2 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)method_local);
  pLVar1 = LogMessage::operator<<(pLVar1,psVar2);
  pLVar1 = LogMessage::operator<<(pLVar1,"\n  Problem     : ");
  pLVar1 = LogMessage::operator<<(pLVar1,local_28);
  LogFinisher::operator=(local_6d,pLVar1);
  LogMessage::~LogMessage(&local_60);
  return;
}

Assistant:

void ReportReflectionUsageError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, const char* description) {
  GOOGLE_LOG(FATAL)
    << "Protocol Buffer reflection usage error:\n"
       "  Method      : google::protobuf::Reflection::" << method << "\n"
       "  Message type: " << descriptor->full_name() << "\n"
       "  Field       : " << field->full_name() << "\n"
       "  Problem     : " << description;
}